

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool isItAFunction<ThreeWiseHash<unsigned_long_long,unsigned_char>>(uint L)

{
  bool bVar1;
  uint32_conflict uVar2;
  reference pvVar3;
  _Map_pointer ppuVar4;
  reference puVar5;
  ostream *poVar6;
  unsigned_long_long uVar7;
  void *pvVar8;
  byte *pbVar9;
  uint local_1cdc;
  undefined1 local_1cd8 [4];
  uint j;
  undefined1 local_1cb8 [8];
  iterator ii;
  uint local_1c90;
  char c_1;
  uchar out;
  uint32_conflict k_1;
  uchar c;
  uint32_conflict k;
  undefined1 local_1c78 [8];
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  ThreeWiseHash<unsigned_long_long,_unsigned_char> hf;
  undefined1 local_13a8 [4];
  uint n;
  mersenneRNG generator;
  uint L_local;
  
  generator.n = L;
  mersenneRNG::mersenneRNG((mersenneRNG *)local_13a8,5);
  hf.hasher.hashvalues[0xff]._4_4_ = 3;
  ThreeWiseHash<unsigned_long_long,_unsigned_char>::ThreeWiseHash
            ((ThreeWiseHash<unsigned_long_long,_unsigned_char> *)
             &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,3,generator.n);
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::deque
            ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78);
  for (k_1 = 0; k_1 < 3; k_1 = k_1 + 1) {
    uVar2 = mersenneRNG::operator()((mersenneRNG *)local_13a8);
    out = (char)uVar2 + 'A';
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78,&out);
    ThreeWiseHash<unsigned_long_long,_unsigned_char>::eat
              ((ThreeWiseHash<unsigned_long_long,_unsigned_char> *)
               &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,out);
  }
  local_1c90 = 0;
  do {
    if (99999 < local_1c90) {
      generator._5015_1_ = 1;
LAB_00107767:
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::~deque
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78);
      ThreeWiseHash<unsigned_long_long,_unsigned_char>::~ThreeWiseHash
                ((ThreeWiseHash<unsigned_long_long,_unsigned_char> *)
                 &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
      return (bool)(generator._5015_1_ & 1);
    }
    pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::front
                       ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78);
    ii._M_node._7_1_ = *pvVar3;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78);
    uVar2 = mersenneRNG::operator()((mersenneRNG *)local_13a8);
    ii._M_node._5_1_ = (char)uVar2 + 'A';
    ii._M_node._6_1_ = ii._M_node._5_1_;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78,
               (value_type *)((long)&ii._M_node + 5));
    ThreeWiseHash<unsigned_long_long,_unsigned_char>::update
              ((ThreeWiseHash<unsigned_long_long,_unsigned_char> *)
               &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,ii._M_node._7_1_,ii._M_node._6_1_);
    ppuVar4 = (_Map_pointer)
              ThreeWiseHash<unsigned_long_long,unsigned_char>::
              hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                        ((ThreeWiseHash<unsigned_long_long,unsigned_char> *)
                         &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Deque_impl_data._M_finish._M_node,
                         (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78);
    if (ppuVar4 !=
        s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((iterator *)local_1cb8,
                 (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78);
      while( true ) {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((iterator *)local_1cd8,
                   (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78);
        bVar1 = std::operator!=((_Self *)local_1cb8,(_Self *)local_1cd8);
        if (!bVar1) break;
        puVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator*
                           ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)
                            local_1cb8);
        poVar6 = std::operator<<((ostream *)&std::cout,*puVar5);
        poVar6 = std::operator<<(poVar6," ");
        pbVar9 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator*
                           ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)
                            local_1cb8);
        pvVar8 = (void *)std::ostream::operator<<(poVar6,(uint)*pbVar9);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator++
                  ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_1cb8);
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"bug");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78,0);
      poVar6 = std::operator<<((ostream *)&std::cerr,*pvVar3);
      pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78,1);
      poVar6 = std::operator<<(poVar6,*pvVar3);
      pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78,2);
      poVar6 = std::operator<<(poVar6,*pvVar3);
      poVar6 = std::operator<<(poVar6," was hashed to ");
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(ulonglong)
                                 s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node);
      poVar6 = std::operator<<(poVar6," when true hash value is ");
      uVar7 = ThreeWiseHash<unsigned_long_long,unsigned_char>::
              hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                        ((ThreeWiseHash<unsigned_long_long,unsigned_char> *)
                         &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Deque_impl_data._M_finish._M_node,
                         (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78);
      pvVar8 = (void *)std::ostream::operator<<(poVar6,uVar7);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      for (local_1cdc = 0; local_1cdc < 3; local_1cdc = local_1cdc + 1) {
        pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78,
                            (ulong)local_1cdc);
        poVar6 = std::operator<<((ostream *)&std::cerr,*pvVar3);
        poVar6 = std::operator<<(poVar6,"->");
        pbVar9 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c78,
                            (ulong)local_1cdc);
        pvVar8 = (void *)std::ostream::operator<<(poVar6,hf.hasher.hashvalues[(ulong)*pbVar9 - 1]);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      generator._5015_1_ = 0;
      goto LAB_00107767;
    }
    local_1c90 = local_1c90 + 1;
  } while( true );
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}